

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O1

void __thiscall Args::Command::process(Command *this,Context *ctx)

{
  ulong *puVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  pointer pbVar6;
  ulong uVar7;
  undefined8 uVar8;
  CmdLine *cmdLine;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [24];
  iterator iStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong local_70 [2];
  String local_60;
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  this->m_isDefined = true;
  iVar2 = *(int *)&(this->super_GroupIface).field_0x4c;
  if (iVar2 == 1) {
    local_80._M_allocated_capacity = (size_type)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Command \"","");
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_40,this);
    uVar7 = 0xf;
    if ((ulong *)local_80._M_allocated_capacity != local_70) {
      uVar7 = local_70[0];
    }
    if (uVar7 < (ulong)(local_38 + local_80._8_8_)) {
      uVar7 = 0xf;
      if (local_40 != local_30) {
        uVar7 = local_30[0];
      }
      if (uVar7 < (ulong)(local_38 + local_80._8_8_)) goto LAB_0011015e;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_40,0,(char *)0x0,local_80._M_allocated_capacity);
      cmdLine = (CmdLine *)local_80._8_8_;
    }
    else {
LAB_0011015e:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_80._M_local_buf,(ulong)local_40);
      cmdLine = (CmdLine *)local_80._8_8_;
    }
    local_c0 = &local_b0;
    puVar1 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar1) {
      local_b0 = *puVar1;
      uStack_a8 = puVar4[3];
    }
    else {
      local_b0 = *puVar1;
      local_c0 = (ulong *)*puVar4;
    }
    local_b8 = puVar4[1];
    *puVar4 = puVar1;
    puVar4[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
    pbVar6 = (pointer)(plVar3 + 2);
    if ((pointer)*plVar3 == pbVar6) {
      local_a0._16_8_ = (pbVar6->_M_dataplus)._M_p;
      iStack_88._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar3[3];
      local_a0._0_8_ = (pointer)(local_a0 + 0x10);
    }
    else {
      local_a0._16_8_ = (pbVar6->_M_dataplus)._M_p;
      local_a0._0_8_ = (pointer)*plVar3;
    }
    local_a0._8_8_ = plVar3[1];
    *plVar3 = (long)pbVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    eatOneValue<Args::CmdLine,Args::Context>
              (&local_60,(Args *)ctx,(Context *)local_a0,
               (String *)(this->super_GroupIface).super_ArgIface.m_cmdLine,cmdLine);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_values,
               &local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_a0._16_8_)->_M_p + 1));
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    uVar8 = local_80._M_allocated_capacity;
    if ((ulong *)local_80._M_allocated_capacity == local_70) {
      return;
    }
    goto LAB_001103f6;
  }
  if (iVar2 != 2) {
    return;
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Command \"","");
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_80,this);
  uVar7 = 0xf;
  if (local_c0 != &local_b0) {
    uVar7 = local_b0;
  }
  if (uVar7 < (ulong)(local_80._8_8_ + local_b8)) {
    uVar7 = 0xf;
    if ((ulong *)local_80._M_allocated_capacity != local_70) {
      uVar7 = local_70[0];
    }
    if (uVar7 < (ulong)(local_80._8_8_ + local_b8)) goto LAB_001100ca;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_001100ca:
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c0,local_80._M_allocated_capacity);
  }
  local_a0._0_8_ = local_a0 + 0x10;
  pbVar6 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pbVar6) {
    local_a0._16_8_ = (pbVar6->_M_dataplus)._M_p;
    iStack_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar3[3];
  }
  else {
    local_a0._16_8_ = (pbVar6->_M_dataplus)._M_p;
    local_a0._0_8_ = (pointer)*plVar3;
  }
  local_a0._8_8_ = plVar3[1];
  *plVar3 = (long)pbVar6;
  plVar3[1] = 0;
  *(undefined1 *)&(pbVar6->_M_dataplus)._M_p = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_a0);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
            (ctx,&this->m_values,&local_60,(this->super_GroupIface).super_ArgIface.m_cmdLine);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_a0._16_8_)->_M_p + 1));
  }
  if ((ulong *)local_80._M_allocated_capacity != local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,local_70[0] + 1);
  }
  local_70[0] = local_b0;
  uVar8 = local_c0;
  if (local_c0 == &local_b0) {
    return;
  }
LAB_001103f6:
  operator_delete((void *)uVar8,local_70[0] + 1);
  return;
}

Assistant:

void process(
		//! Context of the command line.
		Context & ctx ) override
	{
		m_isDefined = true;

		switch( m_opt )
		{
			case ValueOptions::ManyValues :
			{
				eatValues( ctx, m_values,
					String( SL( "Command \"" ) ) +
						name() + SL( "\" requires value that wasn't presented." ),
					cmdLine() );
			}
				break;

			case ValueOptions::OneValue :
			{
				m_values.push_back( eatOneValue( ctx,
					String( SL( "Command \"" ) ) + name() +
						SL( "\" requires value that wasn't presented." ),
					cmdLine() ) );
			}
				break;

			default :
				break;
		}
	}